

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
         *this)

{
  JavascriptString *this_00;
  code *pcVar1;
  uint newSize;
  Type TVar2;
  bool bVar3;
  charcount_t cVar4;
  uint uVar5;
  EntryType *dst;
  undefined4 *puVar6;
  char16 *pcVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  hash_t hashCode;
  long lVar11;
  int iVar12;
  int *piVar13;
  Type local_48;
  int *newBuckets;
  Type local_34;
  
  newSize = this->count * 2;
  uVar5 = 4;
  if (4 < newSize) {
    if ((int)newSize < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SizePolicy.h"
                         ,0x32,"(minCapacity_t <= ((int32_t)(((uint32_t)~((uint32_t)0)) >> 1)))",
                         "the next higher power of 2  must fit in uint32");
      if (!bVar3) {
LAB_00e28ee5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    else {
      uVar5 = newSize;
      if ((newSize + 0x7fffffff & newSize) == 0) goto LAB_00e28c97;
    }
    iVar12 = 0x1f;
    if (newSize != 0) {
      for (; newSize >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    uVar5 = 1 << (-((byte)iVar12 ^ 0x1f) & 0x1f);
  }
LAB_00e28c97:
  local_48.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (uVar5 == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<int>>,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator>
              (dst,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    local_34 = uVar5;
    Allocate(this,&local_48.ptr,(EntryType **)&newBuckets,uVar5,newSize);
    Memory::
    CopyArray<Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<int>>,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator>
              ((Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
                *)newBuckets,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar12 = this->count;
    if (0 < iVar12) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      lVar11 = 0;
      piVar13 = newBuckets;
      do {
        if (-2 < piVar13[lVar11 * 8 + 2]) {
          this_00 = *(JavascriptString **)(piVar13 + lVar11 * 8 + 4);
          pcVar7 = Js::JavascriptString::GetString(this_00);
          cVar4 = Js::JavascriptString::GetLength(this_00);
          if (cVar4 == 0) {
            hashCode = 0x2393b8b;
          }
          else {
            uVar8 = 0x811c9dc5;
            uVar9 = 0;
            do {
              uVar10 = (ushort)pcVar7[uVar9] ^ uVar8;
              uVar8 = uVar10 * 0x1000193;
              uVar9 = uVar9 + 1;
            } while (cVar4 != uVar9);
            hashCode = uVar10 * 0x2000326 + 1;
          }
          if (hashCode != piVar13[lVar11 * 8 + 6]) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                               ,0xce,
                               "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                               ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
            if (!bVar3) goto LAB_00e28ee5;
            *puVar6 = 0;
            hashCode = piVar13[lVar11 * 8 + 6];
          }
          uVar5 = GetBucket(hashCode,local_34,this->modFunctionIndex);
          newBuckets[lVar11 * 8 + 2] = local_48.ptr[(int)uVar5];
          local_48.ptr[(int)uVar5] = (int)lVar11;
          iVar12 = this->count;
          piVar13 = newBuckets;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar12);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    TVar2.ptr = local_48.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar2.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar13 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
          *)piVar13;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = local_34;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }